

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_interpolation.c
# Opt level: O2

double filter_generalized_cubic(double t)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar3 = ABS(t);
  dVar1 = t * t;
  if (1.0 <= dVar3) {
    dVar2 = 0.0;
    if (dVar3 < 2.0) {
      dVar2 = dVar3 * -4.0 + dVar1 * -0.5 * dVar3 + dVar1 * 2.5 + 2.0;
    }
  }
  else {
    dVar2 = dVar1 * 1.5 * dVar3 + dVar1 * -2.5 + 1.0;
  }
  return dVar2;
}

Assistant:

static double filter_generalized_cubic(const double t)
{
	const double a = -DEFAULT_FILTER_GENERALIZED_CUBIC;
	double abs_t = (double)fabs(t);
	double abs_t_sq = abs_t * abs_t;
	if (abs_t < 1) return (a + 2) * abs_t_sq * abs_t - (a + 3) * abs_t_sq + 1;
	if (abs_t < 2) return a * abs_t_sq * abs_t - 5 * a * abs_t_sq + 8 * a * abs_t - 4 * a;
	return 0;
}